

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

curl_mimepart * curl_mime_addpart(curl_mime *mime)

{
  curl_mimepart *pcVar1;
  curl_mimepart *pcVar2;
  
  if ((mime != (curl_mime *)0x0) &&
     (pcVar1 = (curl_mimepart *)(*Curl_cmalloc)(0x1b8), pcVar1 != (curl_mimepart *)0x0)) {
    memset(&pcVar1->nextpart,0,0x1a8);
    pcVar1->lastreadstatus = 1;
    (pcVar1->state).ptr = (void *)0x0;
    (pcVar1->state).offset = 0;
    pcVar1->parent = mime;
    pcVar2 = mime->lastpart;
    if (mime->lastpart == (curl_mimepart *)0x0) {
      pcVar2 = (curl_mimepart *)mime;
    }
    pcVar2->nextpart = pcVar1;
    mime->lastpart = pcVar1;
    return pcVar1;
  }
  return (curl_mimepart *)0x0;
}

Assistant:

curl_mimepart *curl_mime_addpart(curl_mime *mime)
{
  curl_mimepart *part;

  if(!mime)
    return NULL;

  part = (curl_mimepart *) malloc(sizeof(*part));

  if(part) {
    Curl_mime_initpart(part);
    part->parent = mime;

    if(mime->lastpart)
      mime->lastpart->nextpart = part;
    else
      mime->firstpart = part;

    mime->lastpart = part;
  }

  return part;
}